

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_Superellipsoid.cpp
# Opt level: O1

Point3 * __thiscall
sch::S_Superellipsoid::l_Support
          (Point3 *__return_storage_ptr__,S_Superellipsoid *this,Vector3 *v,int *param_2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_78;
  double local_68;
  
  dVar7 = ABS(v->m_x) * this->a_;
  dVar6 = ABS(v->m_y) * this->b_;
  dVar4 = this->c_;
  dVar5 = ABS(v->m_z) * dVar4;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar4 = pow(dVar6 / dVar7,this->_2on2_e2);
    local_68 = 1.0 / (dVar4 + 1.0);
    if ((local_68 != 1.0) || (NAN(local_68))) {
      dVar4 = pow(1.0 - local_68,this->_2_e2on2);
      local_78 = (1.0 - local_68) / dVar4;
      local_68 = local_68 / (dVar4 / (dVar6 / dVar7));
      dVar5 = (dVar5 * dVar4) / dVar6;
    }
    else {
      local_68 = 1.0;
      dVar5 = dVar5 / dVar7;
      local_78 = 0.0;
    }
  }
  else {
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      uVar1 = -(ulong)(0.0 < v->m_z);
      __return_storage_ptr__->m_x = 0.0;
      __return_storage_ptr__->m_y = 0.0;
      __return_storage_ptr__->m_z = (double)(~uVar1 & (ulong)-dVar4 | (ulong)dVar4 & uVar1);
      return __return_storage_ptr__;
    }
    dVar5 = dVar5 / dVar6;
    local_78 = 1.0;
    local_68 = 0.0;
  }
  dVar4 = pow(dVar5,this->_2on2_e1);
  dVar4 = 1.0 / (dVar4 + 1.0);
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    dVar6 = pow(1.0 - dVar4,this->_2_e1on2);
    dVar5 = dVar4 / (dVar6 / dVar5);
    local_68 = local_68 * this->a_ * dVar5;
    uVar1 = -(ulong)(0.0 < v->m_x);
    local_78 = local_78 * dVar5 * this->b_;
    uVar2 = -(ulong)(0.0 < v->m_y);
    dVar4 = ((1.0 - dVar4) / dVar6) * this->c_;
    uVar3 = -(ulong)(0.0 < v->m_z);
    __return_storage_ptr__->m_x = (double)(~uVar1 & (ulong)-local_68 | uVar1 & (ulong)local_68);
    __return_storage_ptr__->m_y = (double)(~uVar2 & (ulong)-local_78 | uVar2 & (ulong)local_78);
    __return_storage_ptr__->m_z = (double)(~uVar3 & (ulong)-dVar4 | (ulong)dVar4 & uVar3);
  }
  else {
    local_68 = local_68 * this->a_;
    uVar1 = -(ulong)(0.0 < v->m_x);
    local_78 = local_78 * this->b_;
    uVar2 = -(ulong)(0.0 < v->m_y);
    __return_storage_ptr__->m_x = (double)(~uVar1 & (ulong)-local_68 | uVar1 & (ulong)local_68);
    __return_storage_ptr__->m_y = (double)(~uVar2 & (ulong)-local_78 | (ulong)local_78 & uVar2);
    __return_storage_ptr__->m_z = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Point3 S_Superellipsoid::l_Support(const Vector3 & v, int & /*lastFeature*/) const
{
  Scalar anx, bny, cnz;

  anx = a_ * fabs(v[0]);
  bny = b_ * fabs(v[1]);
  cnz = c_ * fabs(v[2]);

  Scalar cp2, sp2, sp2e, cp2e, spe, cpe, tt1, tt2, ct2;

  if(anx == 0)
  {
    if(bny == 0)
    {
      return Point3(0, 0, c_ * sign(v[2]));
    }
    else
    {
      cp2 = 0;
      sp2 = 1;
      cp2e = 0;
      sp2e = 1;
      cpe = 0;
      spe = 1;
      tt1 = cnz / bny;
    }
  }
  else
  {
    Scalar tp1 = bny / anx;
    Scalar tp2 = pow(tp1, _2on2_e2);
    cp2 = 1 / (tp2 + 1);

    if(cp2 == 1)
    {
      sp2 = 0;
      cp2e = 1;
      sp2e = 0;
      cpe = 1;
      spe = 0;
      tt1 = cnz / anx;
    }
    else
    {
      sp2 = 1 - cp2;
      sp2e = pow(sp2, _2_e2on2);
      cp2e = sp2e / tp1;
      spe = sp2 / sp2e;
      cpe = cp2 / cp2e;
      tt1 = cnz * sp2e / bny;
    }
  }

  tt2 = pow(tt1, _2on2_e1);
  ct2 = 1 / (tt2 + 1);

  if(ct2 == 1)
  {
    return Point3(a_ * cpe * sign(v[0]), b_ * spe * sign(v[1]), 0);
  }
  else
  {
    Scalar st2 = 1 - ct2;
    Scalar st2e = pow(st2, _2_e1on2);
    Scalar ct2e = st2e / tt1;
    Scalar ste = st2 / st2e;
    Scalar cte = ct2 / ct2e;
    return Point3(a_ * cte * cpe * sign(v[0]), b_ * cte * spe * sign(v[1]), c_ * ste * sign(v[2]));
  }
}